

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stonemask.cc
# Opt level: O2

void sptk::world::StoneMask
               (double *x,int x_length,int fs,double *temporal_positions,double *f0,int f0_length,
               double *refined_f0)

{
  double initial_f0;
  double dVar1;
  double dVar2;
  double dVar3;
  int i_2;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  long lVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  double *pdVar12;
  void *pvVar13;
  double *power_spectrum;
  double *numerator_i;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  int i_6;
  long lVar17;
  ulong uVar18;
  fft_plan *pfVar19;
  undefined8 *puVar20;
  ulong uVar21;
  int i;
  ulong uVar22;
  long lVar23;
  int iVar24;
  int fft_size;
  bool bVar25;
  byte bVar26;
  double dVar27;
  double dVar28;
  fft_plan in_stack_fffffffffffffe58;
  ForwardRealFFT local_98;
  
  bVar26 = 0;
  dVar1 = (double)fs;
  uVar21 = (ulong)(uint)f0_length;
  if (f0_length < 1) {
    uVar21 = 0;
  }
  for (uVar16 = 0; uVar16 != uVar21; uVar16 = uVar16 + 1) {
    initial_f0 = f0[uVar16];
    dVar27 = 0.0;
    if ((40.0 < initial_f0) && (initial_f0 <= dVar1 / 12.0)) {
      dVar27 = (dVar1 * 1.5) / initial_f0 + 1.0;
      iVar24 = (int)dVar27;
      dVar28 = (double)(int)dVar27;
      dVar27 = temporal_positions[uVar16];
      uVar4 = iVar24 * 2 + 1;
      lVar17 = (long)(int)uVar4;
      uVar22 = lVar17 * 8;
      if (iVar24 < 0) {
        uVar22 = 0xffffffffffffffff;
      }
      pvVar6 = operator_new__(uVar22);
      uVar18 = 0;
      if (0 < (int)uVar4) {
        uVar18 = (ulong)uVar4;
      }
      for (uVar14 = 0; uVar18 != uVar14; uVar14 = uVar14 + 1) {
        *(double *)((long)pvVar6 + uVar14 * 8) = (double)((int)uVar14 - iVar24) / dVar1;
      }
      dVar28 = dVar28 + dVar28 + 1.0;
      dVar2 = log(dVar28);
      dVar2 = exp2((double)(int)(dVar2 / 0.6931471805599453) + 2.0);
      fft_size = (int)dVar2;
      local_98.forward_fft.ip = (int *)0x0;
      local_98.forward_fft.w = (double *)0x0;
      local_98.forward_fft.out = (double *)0x0;
      local_98.forward_fft.input = (double *)0x0;
      local_98.forward_fft.in = (double *)0x0;
      local_98.forward_fft.c_out = (fft_complex *)0x0;
      local_98.forward_fft.flags = 0;
      local_98.forward_fft._12_4_ = 0;
      local_98.forward_fft.c_in = (fft_complex *)0x0;
      local_98.spectrum = (fft_complex *)0x0;
      local_98.forward_fft.n = 0;
      local_98.forward_fft.sign = 0;
      local_98.fft_size = 0;
      local_98._4_4_ = 0;
      local_98.waveform = (double *)0x0;
      InitializeForwardRealFFT(fft_size,&local_98);
      lVar7 = (long)fft_size;
      uVar14 = lVar7 << 4;
      if (fft_size < 0) {
        uVar14 = 0xffffffffffffffff;
      }
      pvVar8 = operator_new__(uVar14);
      pvVar9 = operator_new__(uVar14);
      uVar14 = lVar17 * 4;
      if (iVar24 < 0) {
        uVar14 = 0xffffffffffffffff;
      }
      pvVar10 = operator_new__(uVar14);
      pvVar11 = operator_new__(uVar22);
      pdVar12 = (double *)operator_new__(uVar22);
      for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
        iVar5 = matlab_round((*(double *)((long)pvVar6 + uVar22 * 8) + dVar27) * dVar1);
        *(int *)((long)pvVar10 + uVar22 * 4) = iVar5;
      }
      dVar28 = dVar28 / dVar1;
      for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
        dVar2 = ((double)*(int *)((long)pvVar10 + uVar22 * 4) + -1.0) / dVar1 - dVar27;
        dVar3 = cos((dVar2 * 6.283185307179586) / dVar28);
        dVar2 = cos((dVar2 * 12.566370614359172) / dVar28);
        *(double *)((long)pvVar11 + uVar22 * 8) = dVar2 * 0.08 + dVar3 * 0.5 + 0.42;
      }
      *pdVar12 = *(double *)((long)pvVar11 + 8) * -0.5;
      for (lVar15 = 1; lVar15 < iVar24 * 2; lVar15 = lVar15 + 1) {
        pdVar12[lVar15] =
             (*(double *)((long)pvVar11 + lVar15 * 8 + 8) -
             *(double *)((long)pvVar11 + lVar15 * 8 + -8)) * -0.5;
      }
      pdVar12[iVar24 * 2] = *(double *)((long)pvVar11 + lVar17 * 8 + -0x10) * 0.5;
      uVar22 = lVar17 * 4;
      if (iVar24 < 0) {
        uVar22 = 0xffffffffffffffff;
      }
      pvVar13 = operator_new__(uVar22);
      for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
        iVar24 = *(int *)((long)pvVar10 + uVar22 * 4) + -1;
        if (x_length + -1 < iVar24) {
          iVar24 = x_length + -1;
        }
        if (iVar24 < 1) {
          iVar24 = 0;
        }
        *(int *)((long)pvVar13 + uVar22 * 4) = iVar24;
      }
      for (uVar22 = 0; lVar15 = lVar17, uVar18 != uVar22; uVar22 = uVar22 + 1) {
        local_98.waveform[uVar22] =
             x[*(int *)((long)pvVar13 + uVar22 * 4)] * *(double *)((long)pvVar11 + uVar22 * 8);
      }
      for (; lVar15 < lVar7; lVar15 = lVar15 + 1) {
        local_98.waveform[lVar15] = 0.0;
      }
      pfVar19 = &local_98.forward_fft;
      puVar20 = (undefined8 *)&stack0xfffffffffffffe58;
      for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar20 = *(undefined8 *)pfVar19;
        pfVar19 = (fft_plan *)((long)pfVar19 + ((ulong)bVar26 * -2 + 1) * 8);
        puVar20 = puVar20 + (ulong)bVar26 * -2 + 1;
      }
      fft_execute(in_stack_fffffffffffffe58);
      iVar5 = fft_size / 2;
      iVar24 = -1;
      if (-1 < iVar5) {
        iVar24 = iVar5;
      }
      lVar23 = (ulong)(iVar24 + 1) << 4;
      for (lVar15 = 0; lVar23 != lVar15; lVar15 = lVar15 + 0x10) {
        *(undefined8 *)((long)pvVar8 + lVar15) = *(undefined8 *)((long)*local_98.spectrum + lVar15);
        *(undefined8 *)((long)pvVar8 + lVar15 + 8) =
             *(undefined8 *)((long)*local_98.spectrum + lVar15 + 8);
      }
      for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
        local_98.waveform[uVar22] = x[*(int *)((long)pvVar13 + uVar22 * 4)] * pdVar12[uVar22];
      }
      for (; lVar17 < lVar7; lVar17 = lVar17 + 1) {
        local_98.waveform[lVar17] = 0.0;
      }
      pfVar19 = &local_98.forward_fft;
      puVar20 = (undefined8 *)&stack0xfffffffffffffe58;
      for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
        *puVar20 = *(undefined8 *)pfVar19;
        pfVar19 = (fft_plan *)((long)pfVar19 + ((ulong)bVar26 * -2 + 1) * 8);
        puVar20 = puVar20 + (ulong)bVar26 * -2 + 1;
      }
      fft_execute(in_stack_fffffffffffffe58);
      for (lVar17 = 0; lVar23 != lVar17; lVar17 = lVar17 + 0x10) {
        *(undefined8 *)((long)pvVar9 + lVar17) = *(undefined8 *)((long)*local_98.spectrum + lVar17);
        *(undefined8 *)((long)pvVar9 + lVar17 + 8) =
             *(undefined8 *)((long)*local_98.spectrum + lVar17 + 8);
      }
      operator_delete__(pvVar13);
      uVar22 = (long)iVar5 * 8 + 8;
      if (fft_size < -3) {
        uVar22 = 0xffffffffffffffff;
      }
      power_spectrum = (double *)operator_new__(uVar22);
      numerator_i = (double *)operator_new__(uVar22);
      uVar4 = iVar5 + 1U;
      if ((int)(iVar5 + 1U) < 1) {
        uVar4 = 0;
      }
      uVar22 = (ulong)uVar4;
      lVar17 = 4;
      while (bVar25 = uVar22 != 0, uVar22 = uVar22 - 1, bVar25) {
        dVar27 = *(double *)((long)pvVar8 + lVar17 * 2 + -8);
        dVar28 = *(double *)((long)pvVar8 + lVar17 * 2);
        *(double *)((long)numerator_i + lVar17 + -4) =
             *(double *)((long)pvVar9 + lVar17 * 2) * dVar27 -
             *(double *)((long)pvVar9 + lVar17 * 2 + -8) * dVar28;
        *(double *)((long)power_spectrum + lVar17 + -4) = dVar27 * dVar27 + dVar28 * dVar28;
        lVar17 = lVar17 + 8;
      }
      dVar27 = anon_unknown_0::FixF0(power_spectrum,numerator_i,fft_size,fs,initial_f0,2);
      dVar28 = 0.0;
      if ((0.0 < dVar27) && (dVar27 <= initial_f0 + initial_f0)) {
        dVar28 = anon_unknown_0::FixF0(power_spectrum,numerator_i,fft_size,fs,dVar27,6);
      }
      operator_delete__(pvVar9);
      operator_delete__(pdVar12);
      operator_delete__(pvVar11);
      operator_delete__(pvVar10);
      operator_delete__(numerator_i);
      operator_delete__(power_spectrum);
      operator_delete__(pvVar8);
      DestroyForwardRealFFT(&local_98);
      uVar22 = -(ulong)(initial_f0 * 0.2 < ABS(dVar28 - initial_f0));
      dVar27 = (double)(~uVar22 & (ulong)dVar28 | (ulong)initial_f0 & uVar22);
      operator_delete__(pvVar6);
    }
    refined_f0[uVar16] = dVar27;
  }
  return;
}

Assistant:

void StoneMask(const double *x, int x_length, int fs,
    const double *temporal_positions, const double *f0, int f0_length,
    double *refined_f0) {
  for (int i = 0; i < f0_length; i++)
    refined_f0[i] =
      GetRefinedF0(x, x_length, fs, temporal_positions[i], f0[i]);
}